

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmElfRelocator.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
ArmElfRelocator::generateCtorStub
          (ArmElfRelocator *this,vector<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_> *ctors)

{
  byte bVar1;
  char *pcVar2;
  long *in_RDX;
  long *plVar3;
  undefined1 auVar4 [8];
  unsigned_long *in_R9;
  long lVar5;
  ulong uVar6;
  initializer_list<AssemblyTemplateArgument> variables;
  initializer_list<AssemblyTemplateArgument> variables_00;
  string table;
  Parser parser;
  allocator<char> local_2d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  char *local_2b0;
  _Head_base<0UL,_CAssemblerCommand_*,_false> local_2a8;
  Identifier local_2a0;
  Identifier local_280;
  Identifier local_260;
  Identifier local_240;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  char *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  char *local_1d8;
  string local_1d0;
  char *local_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  char *local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  char *local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  char *local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  char *local_110;
  long *local_108 [2];
  long local_f8 [2];
  unsigned_long local_e8;
  undefined1 local_e0 [24];
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  local_c8;
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  local_98;
  pointer local_48;
  pointer local_38;
  
  Parser::Parser((Parser *)local_e0);
  if (in_RDX[1] == *in_RDX) {
    local_200 = (undefined1  [8])&local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"bx r14","");
    variables_00._M_len = 0;
    variables_00._M_array = (iterator)local_200;
    Parser::parseTemplate((Parser *)this,(string *)local_e0,variables_00);
    auVar4 = local_200;
    if (local_200 == (undefined1  [8])&local_1f0) goto LAB_0015f65c;
  }
  else {
    bVar1 = *(char *)&(ctors->
                      super__Vector_base<ElfRelocatorCtor,_std::allocator<ElfRelocatorCtor>_>).
                      _M_impl.super__Vector_impl_data._M_finish == '\0' & Arm.thumb;
    local_2b0 = "0";
    if (bVar1 != 0) {
      local_2b0 = "1";
    }
    local_2d0 = &local_2c0;
    local_2c8 = 0;
    local_2c0._M_local_buf[0] = '\0';
    local_2a8._M_head_impl = (CAssemblerCommand *)this;
    if (in_RDX[1] != *in_RDX) {
      lVar5 = 0x20;
      uVar6 = 0;
      do {
        if (uVar6 != 0) {
          std::__cxx11::string::push_back((char)&local_2d0);
        }
        pcVar2 = (char *)(*in_RDX + lVar5 + -0x20);
        tinyformat::format<Identifier,Identifier,unsigned_long>
                  ((string *)local_200,(tinyformat *)"%s,%s+0x%08X",pcVar2,(Identifier *)pcVar2,
                   (Identifier *)(*in_RDX + lVar5),in_R9);
        std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_200);
        if (local_200 != (undefined1  [8])&local_1f0) {
          operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar6 < (ulong)((in_RDX[1] - *in_RDX >> 3) * -0x3333333333333333));
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_220,ctorTemplate,&local_2d1);
    local_200 = (undefined1  [8])0x18fcf8;
    SymbolTable::getUniqueLabelName(&local_240,&Global.symbolTable,false);
    local_1f8 = local_1f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_240._name._M_dataplus._M_p,
               local_240._name._M_dataplus._M_p + local_240._name._M_string_length);
    local_1d8 = "%ctorTableSize%";
    local_e8 = ((ulong)(in_RDX[1] - *in_RDX) >> 3) * 0x6666666666666668;
    tinyformat::format<unsigned_long>(&local_1d0,"%d",&local_e8);
    local_1b0 = "%outerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_260,&Global.symbolTable,false);
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_260._name._M_dataplus._M_p,
               local_260._name._M_dataplus._M_p + local_260._name._M_string_length);
    local_188 = "%innerLoopLabel%";
    SymbolTable::getUniqueLabelName(&local_280,&Global.symbolTable,false);
    local_180[0] = local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_180,local_280._name._M_dataplus._M_p,
               local_280._name._M_dataplus._M_p + local_280._name._M_string_length);
    local_160 = "%stubName%";
    SymbolTable::getUniqueLabelName(&local_2a0,&Global.symbolTable,false);
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,local_2a0._name._M_dataplus._M_p,
               local_2a0._name._M_dataplus._M_p + local_2a0._name._M_string_length);
    this = (ArmElfRelocator *)local_2a8._M_head_impl;
    local_138 = "%simpleMode%";
    local_130[0] = local_120;
    pcVar2 = "0";
    if (bVar1 != 0) {
      pcVar2 = "1";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,local_2b0,pcVar2 + 1);
    local_110 = "%ctorContent%";
    plVar3 = local_f8;
    local_108[0] = plVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,local_2d0,local_2d0->_M_local_buf + local_2c8);
    variables._M_len = (size_type)local_200;
    variables._M_array = (iterator)local_220;
    Parser::parseTemplate((Parser *)this,(string *)local_e0,variables);
    lVar5 = -0x118;
    do {
      if (plVar3 != (long *)plVar3[-2]) {
        operator_delete((long *)plVar3[-2],*plVar3 + 1);
      }
      plVar3 = plVar3 + -5;
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._name._M_dataplus._M_p != &local_2a0._name.field_2) {
      operator_delete(local_2a0._name._M_dataplus._M_p,
                      local_2a0._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._name._M_dataplus._M_p != &local_280._name.field_2) {
      operator_delete(local_280._name._M_dataplus._M_p,
                      local_280._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._name._M_dataplus._M_p != &local_260._name.field_2) {
      operator_delete(local_260._name._M_dataplus._M_p,
                      local_260._name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._name._M_dataplus._M_p != &local_240._name.field_2) {
      operator_delete(local_240._name._M_dataplus._M_p,
                      local_240._name.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    if (local_2d0 == &local_2c0) goto LAB_0015f65c;
    local_1f0._M_allocated_capacity =
         CONCAT71(local_2c0._M_allocated_capacity._1_7_,local_2c0._M_local_buf[0]);
    auVar4 = (undefined1  [8])local_2d0;
  }
  operator_delete((void *)auVar4,local_1f0._M_allocated_capacity + 1);
LAB_0015f65c:
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
  ::~_Rb_tree(&local_c8);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
  }
  return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)
         (CAssemblerCommand *)this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> ArmElfRelocator::generateCtorStub(std::vector<ElfRelocatorCtor>& ctors)
{
	Parser parser;
	if (ctors.size() != 0)
	{
		bool simpleMode = arm9 == false && Arm.GetThumbMode();

		// create constructor table
		std::string table;
		for (size_t i = 0; i < ctors.size(); i++)
		{
			if (i != 0)
				table += ',';
			table += tfm::format("%s,%s+0x%08X",ctors[i].symbolName,ctors[i].symbolName,ctors[i].size);
		}

		return parser.parseTemplate(ctorTemplate,{
			{ "%ctorTable%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%ctorTableSize%",	tfm::format("%d",ctors.size()*8) },
			{ "%outerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%innerLoopLabel%",	Global.symbolTable.getUniqueLabelName().string() },
			{ "%stubName%",		Global.symbolTable.getUniqueLabelName().string() },
			{ "%simpleMode%",		simpleMode ? "1" : "0" },
			{ "%ctorContent%",		table },
		});
	} else {
		return parser.parseTemplate("bx r14");
	}
}